

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O0

void __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::visit(rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
        *this,typed_unary_expression_t *expr)

{
  typed_unary_expression_t *ptVar1;
  unary_operator_t uVar2;
  expression_type_t eVar3;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  typed_unary_expression_t *local_18;
  typed_unary_expression_t *expr_local;
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  *this_local;
  
  local_18 = expr;
  expr_local = (typed_unary_expression_t *)this;
  uVar2 = unary_expression_t::unary_operator(&expr->super_unary_expression_t);
  if (uVar2 == EXPR_OP_NEG) {
    eVar3 = typed_expression_t::type(&local_18->super_typed_expression_t);
    ptVar1 = local_18;
    if (eVar3 != EXPR_TYPE_INTTERM) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"an unary expression",&local_39);
      invalid_expression(this,&ptVar1->super_typed_expression_t,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator(&local_39);
    }
  }
  else {
    uVar2 = unary_expression_t::unary_operator(&local_18->super_unary_expression_t);
    if ((uVar2 == EXPR_OP_LNOT) &&
       (eVar3 = typed_expression_t::type(&local_18->super_typed_expression_t), ptVar1 = local_18,
       eVar3 != EXPR_TYPE_ATOMIC_PREDICATE)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"an unary expression",&local_71);
      invalid_expression(this,&ptVar1->super_typed_expression_t,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
    }
  }
  compile_unary_expression(this,local_18);
  return;
}

Assistant:

virtual void visit(tchecker::typed_unary_expression_t const & expr)
  {
    // NEG expresison
    if (expr.unary_operator() == tchecker::EXPR_OP_NEG) {
      if (expr.type() != tchecker::EXPR_TYPE_INTTERM)
        invalid_expression(expr, "an unary expression");
    }
    // LNOT expression
    else if (expr.unary_operator() == tchecker::EXPR_OP_LNOT) {
      if (expr.type() != tchecker::EXPR_TYPE_ATOMIC_PREDICATE)
        invalid_expression(expr, "an unary expression");
    }

    compile_unary_expression(expr);
  }